

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_move.cc
# Opt level: O2

string * __thiscall
hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiMove *this)

{
  char cVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  switch(this->move_type_) {
  case kPlay:
    std::__cxx11::to_string(&local_78,(int)this->card_index_);
    std::operator+(&bStack_98,"(Play ",&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,")");
    break;
  case kDiscard:
    std::__cxx11::to_string(&local_78,(int)this->card_index_);
    std::operator+(&bStack_98,"(Discard ",&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,")");
    break;
  case kRevealColor:
    std::__cxx11::to_string(&local_38,(int)this->target_offset_);
    std::operator+(&local_58,"(Reveal player +",&local_38);
    std::operator+(&local_78,&local_58," color ");
    cVar1 = ColorIndexToChar((int)this->color_);
    std::operator+(&bStack_98,&local_78,cVar1);
    std::operator+(__return_storage_ptr__,&bStack_98,")");
    goto LAB_0010f6ad;
  case kRevealRank:
    std::__cxx11::to_string(&local_38,(int)this->target_offset_);
    std::operator+(&local_58,"(Reveal player +",&local_38);
    std::operator+(&local_78,&local_58," rank ");
    cVar1 = RankIndexToChar((int)this->rank_);
    std::operator+(&bStack_98,&local_78,cVar1);
    std::operator+(__return_storage_ptr__,&bStack_98,")");
LAB_0010f6ad:
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_38;
    goto LAB_0010f713;
  case kDeal:
    if (this->color_ < '\0') {
      pcVar2 = "(Deal XX)";
      goto LAB_0010f72a;
    }
    std::__cxx11::string::string((string *)&local_58,"(Deal ",(allocator *)&local_38);
    cVar1 = ColorIndexToChar((int)this->color_);
    std::operator+(&local_78,&local_58,cVar1);
    cVar1 = RankIndexToChar((int)this->rank_);
    std::operator+(&bStack_98,&local_78,cVar1);
    std::operator+(__return_storage_ptr__,&bStack_98,")");
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_58;
    goto LAB_0010f713;
  default:
    pcVar2 = "(INVALID)";
LAB_0010f72a:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&bStack_98);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&bStack_98);
  this_00 = &local_78;
LAB_0010f713:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiMove::ToString() const {
  switch (MoveType()) {
    case kPlay:
      return "(Play " + std::to_string(CardIndex()) + ")";
    case kDiscard:
      return "(Discard " + std::to_string(CardIndex()) + ")";
    case kRevealColor:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " color " +
             ColorIndexToChar(Color()) + ")";
    case kRevealRank:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " rank " +
             RankIndexToChar(Rank()) + ")";
    case kDeal:
      if (color_ >= 0) {
        return std::string("(Deal ") + ColorIndexToChar(Color()) +
               RankIndexToChar(Rank()) + ")";
      } else {
        return std::string("(Deal XX)");
      }
    default:
      return "(INVALID)";
  }
}